

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O2

void __thiscall
VRasterizer::rasterize
          (VRasterizer *this,VPath *path,CapStyle cap,JoinStyle join,float width,float miterLimit,
          VRect *clip)

{
  VRleTask *this_00;
  VPath *__stat_loc;
  VPath local_38;
  
  __stat_loc = path;
  init(this,(EVP_PKEY_CTX *)path);
  this_00 = &((this->d).super___shared_ptr<VRasterizer::VRasterizerImpl,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->mTask;
  if ((1e-06 < ABS(width)) &&
     (local_38 = (VPath)(path->d).mModel,
     (((model *)local_38.d.mModel)->mValue).m_elements.
     super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
     super__Vector_impl_data._M_start !=
     (((model *)local_38.d.mModel)->mValue).m_elements.
     super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    (path->d).mModel = (model *)0x0;
    VRleTask::update(this_00,&local_38,cap,join,width,miterLimit,clip);
    vcow_ptr<VPath::VPathData>::~vcow_ptr(&local_38.d);
    updateRequest(this);
    return;
  }
  SharedRle::wait(&this_00->mRle,__stat_loc);
  VRle::reset((VRle *)this_00);
  return;
}

Assistant:

void VRasterizer::rasterize(VPath path, CapStyle cap, JoinStyle join,
                            float width, float miterLimit, const VRect &clip)
{
    init();
    if (path.empty() || vIsZero(width)) {
        d->rle().reset();
        return;
    }
    d->task().update(std::move(path), cap, join, width, miterLimit, clip);
    updateRequest();
}